

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::__encodeArray
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  uint uVar1;
  reference pvVar2;
  undefined1 *puVar3;
  undefined4 *in_RCX;
  long in_RDX;
  byte *pbVar4;
  uint *__dest;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  uint32_t in_stack_0000000c;
  uint8_t *in_stack_00000010;
  uint8_t *in_stack_00000018;
  uint8_t *in_stack_00000020;
  size_t outcap;
  uint8_t *pad8;
  uint32_t bytescontainersize;
  uint32_t k;
  uint32_t maxval;
  uint8_t maxb;
  uint8_t bestcexcept;
  uint8_t bestb;
  uint32_t *final;
  uint8_t *bc;
  uint32_t *headerout;
  uint32_t *initout;
  value_type_conflict1 *in_stack_ffffffffffffff68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  undefined1 *local_68;
  uint local_54;
  byte local_4a;
  byte local_49;
  byte *local_40;
  uint *local_20;
  long local_10;
  
  checkifdivisibleby((size_t)in_stack_00000010,in_stack_0000000c);
  local_20 = in_RCX + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x13bf66);
  local_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x30),0);
  for (local_10 = in_RSI; local_10 + 0x200U <= (ulong)(in_RSI + in_RDX * 4);
      local_10 = local_10 + 0x200) {
    getBestBFromData((SimplePFor<FastPForLib::Simple8b<true>_> *)pad8,(uint32_t *)outcap,
                     in_stack_00000020,in_stack_00000018,in_stack_00000010);
    pbVar4 = local_40 + 1;
    *local_40 = local_49;
    local_40 = local_40 + 2;
    *pbVar4 = local_4a;
    if (local_4a != 0) {
      for (local_54 = 0; local_54 < 0x80; local_54 = local_54 + 1) {
        if ((uint)(1 << (local_49 & 0x1f)) <= *(uint *)(local_10 + (ulong)local_54 * 4)) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          *local_40 = (byte)local_54;
          local_40 = local_40 + 1;
        }
      }
    }
    local_20 = packblockup<128u,unsigned_int>
                         ((uint *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
  }
  *in_RCX = (int)((long)local_20 - (long)in_RCX >> 2);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x30),0);
  uVar1 = (int)local_40 - (int)pvVar2;
  __dest = local_20 + 1;
  *local_20 = uVar1;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x30),0);
  memcpy(__dest,pvVar2,(ulong)uVar1);
  puVar3 = (undefined1 *)(((ulong)uVar1 + 3 & 0xfffffffffffffffc) + (long)__dest);
  local_68 = (undefined1 *)((long)__dest + (ulong)uVar1);
  while (local_68 < puVar3) {
    *local_68 = 0;
    local_68 = local_68 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x13c1d2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x18));
  Simple8b<true>::encodeArray
            ((Simple8b<true> *)length,out,(size_t)nvalue,initout,(size_t *)headerout);
  *in_R8 = (long)puVar3 - (long)in_RCX >> 2;
  return;
}

Assistant:

void __encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                     size_t &nvalue) {
    uint32_t *const initout = out; // keep track of this
    checkifdivisibleby(length, BlockSize);
    uint32_t *const headerout = out++; // keep track of this
    datatobepacked.clear();
    uint8_t *bc = &bytescontainer[0];
    for (const uint32_t *const final = in + length; (in + BlockSize <= final);
         in += BlockSize) {
      uint8_t bestb, bestcexcept, maxb;
      getBestBFromData(in, bestb, bestcexcept, maxb);
      *bc++ = bestb;
      *bc++ = bestcexcept;
      if (bestcexcept > 0) {
        assert(bestb < 32);
        const uint32_t maxval = 1U << bestb;
        for (uint32_t k = 0; k < BlockSize; ++k) {
          if (in[k] >= maxval) {
            datatobepacked.push_back(in[k] >> bestb);
            *bc++ = static_cast<uint8_t>(k);
          }
        }
      }
      out = packblockup<BlockSize>(in, out, bestb);
    }
    headerout[0] = static_cast<uint32_t>(out - headerout);
    const uint32_t bytescontainersize =
        static_cast<uint32_t>(bc - &bytescontainer[0]);
    *(out++) = bytescontainersize;
    memcpy(out, &bytescontainer[0], bytescontainersize);
    uint8_t* pad8 = (uint8_t*)out + bytescontainersize;
    out += (bytescontainersize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    while (pad8 < (uint8_t*)out)
        *pad8++ = 0; // clear padding bytes

    size_t outcap = 0;
    ecoder.encodeArray(datatobepacked.data(), datatobepacked.size(), out,
                       outcap);
    out += outcap;
    nvalue = out - initout;
  }